

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

int getNumberOfArmies(int numberOfPlayers)

{
  int local_c;
  int numberOfPlayers_local;
  
  switch(numberOfPlayers) {
  case 2:
    local_c = 0x28;
    break;
  case 3:
    local_c = 0x23;
    break;
  case 4:
    local_c = 0x1e;
    break;
  case 5:
    local_c = 0x19;
    break;
  case 6:
    local_c = 0x14;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int getNumberOfArmies(int numberOfPlayers) {
    switch (numberOfPlayers) {
        case 2:
            return 40;
        case 3:
            return 35;
        case 4:
            return 30;
        case 5:
            return 25;
        case 6:
            return 20;
        default:
            return 0;
    }
}